

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O3

void WOPN_Free(WOPNFile *file)

{
  if (file != (WOPNFile *)0x0) {
    if (file->banks_melodic != (WOPNBank *)0x0) {
      free(file->banks_melodic);
    }
    if (file->banks_percussive != (WOPNBank *)0x0) {
      free(file->banks_percussive);
    }
    free(file);
    return;
  }
  return;
}

Assistant:

void WOPN_Free(WOPNFile *file)
{
    if(file)
    {
        if(file->banks_melodic)
            free(file->banks_melodic);
        if(file->banks_percussive)
            free(file->banks_percussive);
        free(file);
    }
}